

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query.cc
# Opt level: O0

bool __thiscall
S2ClosestCellQuery::IsDistanceLess(S2ClosestCellQuery *this,Target *target,S1ChordAngle limit)

{
  bool bVar1;
  Result local_68;
  double local_50;
  double local_48;
  undefined1 local_40 [8];
  Options tmp_options;
  Target *target_local;
  S2ClosestCellQuery *this_local;
  S1ChordAngle limit_local;
  
  local_40 = (undefined1  [8])
             (this->options_).super_Options.max_distance_.super_S1ChordAngle.length2_;
  tmp_options.super_Options.max_distance_.super_S1ChordAngle.length2_ =
       (S1ChordAngle)(this->options_).super_Options.max_error_.length2_;
  tmp_options.super_Options.max_error_.length2_ = (double)(this->options_).super_Options.region_;
  tmp_options.super_Options.region_ = *(S2Region **)&(this->options_).super_Options.max_results_;
  tmp_options.super_Options._24_8_ = target;
  S2ClosestCellQueryBase<S2MinDistance>::Options::set_max_results((Options *)local_40,1);
  local_48 = limit.length2_;
  Options::set_max_distance((Options *)local_40,limit);
  local_50 = (double)S1ChordAngle::Straight();
  S2ClosestCellQueryBase<S2MinDistance>::Options::set_max_error((Options *)local_40,(Delta)local_50)
  ;
  S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell
            (&local_68,&this->base_,(Target *)tmp_options.super_Options._24_8_,(Options *)local_40);
  bVar1 = S2ClosestCellQueryBase<S2MinDistance>::Result::is_empty(&local_68);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool S2ClosestCellQuery::IsDistanceLess(Target* target, S1ChordAngle limit) {
  static_assert(sizeof(Options) <= 32, "Consider not copying Options here");
  Options tmp_options = options_;
  tmp_options.set_max_results(1);
  tmp_options.set_max_distance(limit);
  tmp_options.set_max_error(S1ChordAngle::Straight());
  return !base_.FindClosestCell(target, tmp_options).is_empty();
}